

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

void join_regions(chunk *c,int *colors,int *counts,_Bool allow_vault_disconnect)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = c->width * c->height;
  uVar1 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar1;
  }
  iVar4 = 0;
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    iVar4 = iVar4 + (uint)(0 < counts[uVar1]);
  }
  do {
    if (iVar4 < 2) {
      return;
    }
    for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      if (0 < counts[uVar1]) goto LAB_00146718;
    }
    uVar1 = 0xffffffff;
LAB_00146718:
    join_region(c,colors,counts,(wchar_t)uVar1,L'\xffffffff',allow_vault_disconnect);
    iVar4 = iVar4 + -1;
  } while( true );
}

Assistant:

static void join_regions(struct chunk *c, int colors[], int counts[],
		bool allow_vault_disconnect) {
	int h = c->height;
	int w = c->width;
	int size = h * w;
	int num = count_colors(counts, size);

	/* While we have multiple colors (i.e. disconnected regions), join one
	 * of the regions to another one.
	 */
	while (num > 1) {
		int color = first_color(counts, size);
		join_region(c, colors, counts, color, -1,
			allow_vault_disconnect);
		num--;
	}
}